

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

bool __thiscall
libchars::command_cursor::subword(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  _Elt_pointer ppcVar1;
  _Elt_pointer ppcVar2;
  command_node *pcVar3;
  bool bVar4;
  
  ppcVar2 = (this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppcVar2 ==
      (this->S).c.
      super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur) {
    pcVar3 = this->root;
    if (((pcVar3 == (command_node *)0x0) || ((pcVar3->mask & mask) == 0)) ||
       (pcVar3->hidden == true && !ignore_hidden)) goto LAB_0010b06c;
LAB_0010b062:
    bVar4 = pcVar3->start != (command_node *)0x0;
  }
  else {
    ppcVar1 = (this->S).c.
              super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (ppcVar2 == ppcVar1) {
      if ((((this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f] != (command_node *)0x0) &&
          (((this->S).c.
            super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->mask & mask) != 0)) &&
         ((this->S).c.
          super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f]->hidden != true ||
          ignore_hidden)) {
        if (ppcVar2 == ppcVar1) {
          ppcVar2 = (this->S).c.
                    super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        goto LAB_0010b05e;
      }
    }
    else if (((ppcVar2[-1] != (command_node *)0x0) && ((ppcVar2[-1]->mask & mask) != 0)) &&
            (ppcVar2[-1]->hidden != true || ignore_hidden)) {
LAB_0010b05e:
      pcVar3 = ppcVar2[-1];
      goto LAB_0010b062;
    }
LAB_0010b06c:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool command_cursor::subword(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->start != NULL;
    }